

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O2

string * __thiscall
spirv_cross::
join<char_const*&,char_const(&)[20],char_const*&,char_const(&)[8],char_const*&,char_const(&)[34]>
          (string *__return_storage_ptr__,spirv_cross *this,char **ts,char (*ts_1) [20],char **ts_2,
          char (*ts_3) [8],char **ts_4,char (*ts_5) [34])

{
  StringStream<4096UL,_4096UL> stream;
  StringStream<4096UL,_4096UL> local_1120;
  
  StringStream<4096UL,_4096UL>::StringStream(&local_1120);
  inner::
  join_helper<char_const*&,char_const(&)[20],char_const*&,char_const(&)[8],char_const*&,char_const(&)[34]>
            (&local_1120,(char **)this,(char (*) [20])ts,(char **)ts_1,(char (*) [8])ts_2,
             (char **)ts_3,(char (*) [34])ts_4);
  StringStream<4096ul,4096ul>::str_abi_cxx11_
            (__return_storage_ptr__,(StringStream<4096ul,4096ul> *)&local_1120);
  StringStream<4096UL,_4096UL>::~StringStream(&local_1120);
  return __return_storage_ptr__;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}